

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O2

void __thiscall duckdb::ArenaAllocator::AllocateNewBlock(ArenaAllocator *this,idx_t min_size)

{
  ulong uVar1;
  ulong uVar2;
  idx_t *piVar3;
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var4;
  templated_unique_single_t new_chunk;
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> local_28;
  ulong local_20;
  
  _Var4._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  piVar3 = &(_Var4._M_head_impl)->maximum_size;
  if (_Var4._M_head_impl == (ArenaChunk *)0x0) {
    piVar3 = &this->initial_capacity;
  }
  uVar1 = *piVar3;
  uVar2 = 0x1000000;
  if (uVar1 < 0x1000000) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 << (uVar1 < 0x1000000);
  do {
    local_20 = uVar1;
    uVar1 = local_20 * 2;
  } while (local_20 < min_size);
  make_unsafe_uniq<duckdb::ArenaChunk,duckdb::Allocator&,unsigned_long&>
            ((duckdb *)&local_28,this->allocator,&local_20);
  _Var4._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (ArenaChunk *)0x0) {
    this->tail = local_28._M_head_impl;
    _Var4._M_head_impl = local_28._M_head_impl;
  }
  else {
    (_Var4._M_head_impl)->prev = local_28._M_head_impl;
    ::std::__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::operator=
              ((__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
               &(local_28._M_head_impl)->next,
               (__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
               &this->head);
    _Var4._M_head_impl = local_28._M_head_impl;
  }
  local_28._M_head_impl = (ArenaChunk *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::reset
            ((__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
             &this->head,_Var4._M_head_impl);
  this->allocated_size = this->allocated_size + local_20;
  ::std::unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::~unique_ptr
            ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)&local_28);
  return;
}

Assistant:

void ArenaAllocator::AllocateNewBlock(idx_t min_size) {
	idx_t capacity;
	// start off with either (1) initial capacity (if we have no block) or (2) capacity of the previous block
	if (!head) {
		capacity = initial_capacity;
	} else {
		capacity = head->maximum_size;
	}
	// capacity of the previous block can be bigger than the max capacity if we allocate len > max capacity
	// for new blocks - try to set it back to the max capacity
	if (capacity > ARENA_ALLOCATOR_MAX_CAPACITY) {
		capacity = ARENA_ALLOCATOR_MAX_CAPACITY;
	}
	// if we are below the max capacity - double the size of the block
	if (capacity < ARENA_ALLOCATOR_MAX_CAPACITY) {
		capacity *= 2;
	}
	// we double the size until we can fit `len`
	// this is generally only relevant if len is very large
	while (capacity < min_size) {
		capacity *= 2;
	}
	auto new_chunk = make_unsafe_uniq<ArenaChunk>(allocator, capacity);
	if (head) {
		head->prev = new_chunk.get();
		new_chunk->next = std::move(head);
	} else {
		tail = new_chunk.get();
	}
	head = std::move(new_chunk);
	allocated_size += capacity;
}